

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlNodePtr xmlStringLenGetNodeList(xmlDoc *doc,xmlChar *value,int len)

{
  byte *cur;
  byte bVar1;
  byte bVar2;
  int iVar3;
  xmlBufPtr buf;
  xmlEntityPtr pxVar4;
  xmlChar *pxVar5;
  xmlNodePtr pxVar6;
  xmlNodePtr elem;
  _xmlNode *p_Var7;
  xmlNodePtr pxVar8;
  xmlNodePtr pxVar9;
  xmlChar *pxVar10;
  long lVar11;
  byte *pbVar12;
  byte *pbVar13;
  byte *pbVar14;
  xmlChar buffer [10];
  xmlNodePtr local_58;
  xmlChar local_3a [10];
  
  if (value == (xmlChar *)0x0) {
    return (xmlNodePtr)0x0;
  }
  buf = xmlBufCreateSize(0);
  if (buf == (xmlBufPtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  xmlBufSetAllocationScheme(buf,XML_BUFFER_ALLOC_DOUBLEIT);
  if (len < 1) {
    iVar3 = xmlBufIsEmpty(buf);
    if (iVar3 == 0) {
      local_58 = (xmlNodePtr)0x0;
      elem = (xmlNodePtr)0x0;
LAB_00181e97:
      pxVar9 = xmlNewText((xmlChar *)0x0);
      pxVar8 = elem;
      if (pxVar9 != (xmlNodePtr)0x0) {
        pxVar9->doc = doc;
        pxVar10 = xmlBufDetach(buf);
        pxVar9->content = pxVar10;
        pxVar8 = pxVar9;
        if (local_58 != (xmlNodePtr)0x0) {
          xmlAddNextSibling(local_58,pxVar9);
          pxVar8 = elem;
        }
      }
      goto LAB_00181ed5;
    }
  }
  else {
    pbVar14 = value + len;
    elem = (xmlNodePtr)0x0;
    local_58 = (xmlNodePtr)0x0;
    pbVar13 = value;
    do {
      if (*pbVar13 == 0x26) {
        pxVar8 = elem;
        if ((pbVar13 != value) &&
           (iVar3 = xmlBufAdd(buf,value,(int)pbVar13 - (int)value), iVar3 != 0)) goto LAB_00181ed5;
        pbVar12 = pbVar13 + 2;
        if ((pbVar12 < pbVar14) && ((pbVar13[1] == 0x23 && (*pbVar12 == 0x78)))) {
          pbVar12 = pbVar13 + 3;
          iVar3 = 0;
          bVar2 = 0;
          if ((pbVar12 < pbVar14) && (bVar2 = *pbVar12, bVar2 == 0x3b)) {
            iVar3 = 0;
            lVar11 = 1;
          }
          else {
            pbVar13 = pbVar13 + 4;
            do {
              pbVar12 = pbVar13;
              if ((byte)(bVar2 - 0x30) < 10) {
                iVar3 = iVar3 * 0x10 + (uint)bVar2 + -0x30;
              }
              else if ((byte)(bVar2 + 0x9f) < 6) {
                iVar3 = iVar3 * 0x10 + (uint)bVar2 + -0x57;
              }
              else {
                if (5 < (byte)(bVar2 + 0xbf)) {
                  lVar11 = 0;
                  __xmlSimpleError(2,0x514,(xmlNodePtr)doc,"invalid hexadecimal character value\n",
                                   (char *)0x0);
                  pbVar12 = pbVar12 + -1;
                  iVar3 = 0;
                  goto LAB_00181d0b;
                }
                iVar3 = iVar3 * 0x10 + (uint)bVar2 + -0x37;
              }
              if (pbVar12 < pbVar14) {
                bVar2 = *pbVar12;
              }
              else {
                bVar2 = 0;
              }
              pbVar13 = pbVar12 + 1;
            } while (bVar2 != 0x3b);
            lVar11 = 1;
          }
LAB_00181d0b:
          value = pbVar12 + lVar11;
LAB_00181d11:
          pbVar13 = value;
          if (iVar3 != 0) {
            iVar3 = xmlCopyCharMultiByte(local_3a,iVar3);
            local_3a[iVar3] = '\0';
            iVar3 = xmlBufCat(buf,local_3a);
            if (iVar3 != 0) goto LAB_00181ed5;
          }
        }
        else {
          cur = pbVar13 + 1;
          if (pbVar14 <= cur) {
LAB_00181e49:
            __xmlSimpleError(2,0x516,(xmlNodePtr)doc,"unterminated entity reference %15s\n",
                             (char *)cur);
            goto LAB_00181ed5;
          }
          bVar2 = *cur;
          if (bVar2 == 0x23) {
            iVar3 = 0;
            bVar2 = 0;
            if ((pbVar12 < pbVar14) && (bVar2 = *pbVar12, bVar2 == 0x3b)) {
              iVar3 = 0;
              lVar11 = 1;
            }
            else {
              pbVar13 = pbVar13 + 3;
              do {
                pbVar12 = pbVar13;
                if (9 < (byte)(bVar2 - 0x30)) {
                  lVar11 = 0;
                  __xmlSimpleError(2,0x515,(xmlNodePtr)doc,"invalid decimal character value\n",
                                   (char *)0x0);
                  pbVar12 = pbVar12 + -1;
                  iVar3 = 0;
                  goto LAB_00181bca;
                }
                if (pbVar12 < pbVar14) {
                  bVar1 = *pbVar12;
                }
                else {
                  bVar1 = 0;
                }
                iVar3 = (uint)bVar2 + iVar3 * 10 + -0x30;
                pbVar13 = pbVar12 + 1;
                bVar2 = bVar1;
              } while (bVar1 != 0x3b);
              lVar11 = 1;
            }
LAB_00181bca:
            value = pbVar12 + lVar11;
            goto LAB_00181d11;
          }
          lVar11 = 0;
          while( true ) {
            if (bVar2 == 0) goto LAB_00181e49;
            if (bVar2 == 0x3b) break;
            if (pbVar14 <= pbVar13 + lVar11 + 2) goto LAB_00181e49;
            bVar2 = pbVar13[lVar11 + 2];
            lVar11 = lVar11 + 1;
          }
          if (lVar11 != 0) {
            pxVar10 = xmlStrndup(cur,(int)lVar11);
            pxVar4 = xmlGetDocEntity(doc,pxVar10);
            if ((pxVar4 == (xmlEntityPtr)0x0) || (pxVar4->etype != XML_INTERNAL_PREDEFINED_ENTITY))
            {
              iVar3 = xmlBufIsEmpty(buf);
              pxVar9 = elem;
              pxVar6 = local_58;
              if (iVar3 == 0) {
                pxVar9 = xmlNewText((xmlChar *)0x0);
                if (pxVar9 != (xmlNodePtr)0x0) {
                  pxVar9->doc = doc;
                  pxVar5 = xmlBufDetach(buf);
                  pxVar9->content = pxVar5;
                  pxVar6 = pxVar9;
                  if (local_58 != (xmlNodePtr)0x0) {
                    pxVar6 = xmlAddNextSibling(local_58,pxVar9);
                    pxVar9 = elem;
                  }
                  goto LAB_00181d50;
                }
              }
              else {
LAB_00181d50:
                local_58 = pxVar6;
                elem = xmlNewReference(doc,pxVar10);
                pxVar8 = pxVar9;
                if (elem != (xmlNodePtr)0x0) {
                  if ((pxVar4 != (xmlEntityPtr)0x0) && (pxVar4->children == (_xmlNode *)0x0)) {
                    pxVar4->children = (_xmlNode *)0xffffffffffffffff;
                    pxVar8 = xmlStringGetNodeList(doc,elem->content);
                    pxVar4->children = pxVar8;
                    pxVar4->owner = 1;
                    if (pxVar8 != (xmlNodePtr)0x0) {
                      do {
                        p_Var7 = pxVar8;
                        p_Var7->parent = (_xmlNode *)pxVar4;
                        pxVar8 = p_Var7->next;
                      } while (p_Var7->next != (_xmlNode *)0x0);
                      pxVar4->last = p_Var7;
                    }
                  }
                  pxVar6 = elem;
                  if (local_58 != (xmlNodePtr)0x0) {
                    pxVar6 = xmlAddNextSibling(local_58,elem);
                    elem = pxVar9;
                  }
                  goto LAB_00181de7;
                }
              }
              if (pxVar10 != (xmlChar *)0x0) {
                (*xmlFree)(pxVar10);
              }
              goto LAB_00181ed5;
            }
            iVar3 = xmlBufCat(buf,pxVar4->content);
            pxVar6 = local_58;
            if (iVar3 != 0) goto LAB_00181ed5;
LAB_00181de7:
            local_58 = pxVar6;
            (*xmlFree)(pxVar10);
          }
          value = pbVar13 + lVar11 + 2;
          pbVar13 = value;
        }
      }
      else {
        if (*pbVar13 == 0) break;
        pbVar13 = pbVar13 + 1;
      }
    } while (pbVar13 < pbVar14);
    pxVar8 = elem;
    if ((pbVar13 != value) && (iVar3 = xmlBufAdd(buf,value,(int)pbVar13 - (int)value), iVar3 != 0))
    goto LAB_00181ed5;
    iVar3 = xmlBufIsEmpty(buf);
    if (iVar3 == 0) goto LAB_00181e97;
    if (elem != (xmlNodePtr)0x0) goto LAB_00181ed5;
  }
  pxVar8 = xmlNewText("");
  if (pxVar8 == (xmlNodePtr)0x0) {
    pxVar8 = (xmlNodePtr)0x0;
  }
  else {
    pxVar8->doc = doc;
  }
LAB_00181ed5:
  xmlBufFree(buf);
  return pxVar8;
}

Assistant:

xmlNodePtr
xmlStringLenGetNodeList(const xmlDoc *doc, const xmlChar *value, int len) {
    xmlNodePtr ret = NULL, last = NULL;
    xmlNodePtr node;
    xmlChar *val;
    const xmlChar *cur, *end;
    const xmlChar *q;
    xmlEntityPtr ent;
    xmlBufPtr buf;

    if (value == NULL) return(NULL);
    cur = value;
    end = cur + len;

    buf = xmlBufCreateSize(0);
    if (buf == NULL) return(NULL);
    xmlBufSetAllocationScheme(buf, XML_BUFFER_ALLOC_DOUBLEIT);

    q = cur;
    while ((cur < end) && (*cur != 0)) {
	if (cur[0] == '&') {
	    int charval = 0;
	    xmlChar tmp;

	    /*
	     * Save the current text.
	     */
            if (cur != q) {
		if (xmlBufAdd(buf, q, cur - q))
		    goto out;
	    }
	    q = cur;
	    if ((cur + 2 < end) && (cur[1] == '#') && (cur[2] == 'x')) {
		cur += 3;
		if (cur < end)
		    tmp = *cur;
		else
		    tmp = 0;
		while (tmp != ';') { /* Non input consuming loop */
                    /*
                     * If you find an integer overflow here when fuzzing,
                     * the bug is probably elsewhere. This function should
                     * only receive entities that were already validated by
                     * the parser, typically by xmlParseAttValueComplex
                     * calling xmlStringDecodeEntities.
                     *
                     * So it's better *not* to check for overflow to
                     * potentially discover new bugs.
                     */
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 16 + (tmp - '0');
		    else if ((tmp >= 'a') && (tmp <= 'f'))
			charval = charval * 16 + (tmp - 'a') + 10;
		    else if ((tmp >= 'A') && (tmp <= 'F'))
			charval = charval * 16 + (tmp - 'A') + 10;
		    else {
			xmlTreeErr(XML_TREE_INVALID_HEX, (xmlNodePtr) doc,
			           NULL);
			charval = 0;
			break;
		    }
		    cur++;
		    if (cur < end)
			tmp = *cur;
		    else
			tmp = 0;
		}
		if (tmp == ';')
		    cur++;
		q = cur;
	    } else if ((cur + 1 < end) && (cur[1] == '#')) {
		cur += 2;
		if (cur < end)
		    tmp = *cur;
		else
		    tmp = 0;
		while (tmp != ';') { /* Non input consuming loops */
                    /* Don't check for integer overflow, see above. */
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 10 + (tmp - '0');
		    else {
			xmlTreeErr(XML_TREE_INVALID_DEC, (xmlNodePtr) doc,
			           NULL);
			charval = 0;
			break;
		    }
		    cur++;
		    if (cur < end)
			tmp = *cur;
		    else
			tmp = 0;
		}
		if (tmp == ';')
		    cur++;
		q = cur;
	    } else {
		/*
		 * Read the entity string
		 */
		cur++;
		q = cur;
		while ((cur < end) && (*cur != 0) && (*cur != ';')) cur++;
		if ((cur >= end) || (*cur == 0)) {
		    xmlTreeErr(XML_TREE_UNTERMINATED_ENTITY, (xmlNodePtr) doc,
		               (const char *) q);
		    goto out;
		}
		if (cur != q) {
		    /*
		     * Predefined entities don't generate nodes
		     */
		    val = xmlStrndup(q, cur - q);
		    ent = xmlGetDocEntity(doc, val);
		    if ((ent != NULL) &&
			(ent->etype == XML_INTERNAL_PREDEFINED_ENTITY)) {

			if (xmlBufCat(buf, ent->content))
			    goto out;

		    } else {
			/*
			 * Flush buffer so far
			 */
			if (!xmlBufIsEmpty(buf)) {
			    node = xmlNewDocText(doc, NULL);
			    if (node == NULL) {
				if (val != NULL) xmlFree(val);
				goto out;
			    }
			    node->content = xmlBufDetach(buf);

			    if (last == NULL) {
				last = ret = node;
			    } else {
				last = xmlAddNextSibling(last, node);
			    }
			}

			/*
			 * Create a new REFERENCE_REF node
			 */
			node = xmlNewReference(doc, val);
			if (node == NULL) {
			    if (val != NULL) xmlFree(val);
			    goto out;
			}
			else if ((ent != NULL) && (ent->children == NULL)) {
			    xmlNodePtr temp;

                            /* Set to non-NULL value to avoid recursion. */
			    ent->children = (xmlNodePtr) -1;
			    ent->children = xmlStringGetNodeList(doc,
				    (const xmlChar*)node->content);
			    ent->owner = 1;
			    temp = ent->children;
			    while (temp) {
				temp->parent = (xmlNodePtr)ent;
				ent->last = temp;
				temp = temp->next;
			    }
			}
			if (last == NULL) {
			    last = ret = node;
			} else {
			    last = xmlAddNextSibling(last, node);
			}
		    }
		    xmlFree(val);
		}
		cur++;
		q = cur;
	    }
	    if (charval != 0) {
		xmlChar buffer[10];
		int l;

		l = xmlCopyCharMultiByte(buffer, charval);
		buffer[l] = 0;

		if (xmlBufCat(buf, buffer))
		    goto out;
		charval = 0;
	    }
	} else
	    cur++;
    }

    if (cur != q) {
        /*
	 * Handle the last piece of text.
	 */
	if (xmlBufAdd(buf, q, cur - q))
	    goto out;
    }

    if (!xmlBufIsEmpty(buf)) {
	node = xmlNewDocText(doc, NULL);
	if (node == NULL) goto out;
	node->content = xmlBufDetach(buf);

	if (last == NULL) {
	    ret = node;
	} else {
	    xmlAddNextSibling(last, node);
	}
    } else if (ret == NULL) {
        ret = xmlNewDocText(doc, BAD_CAST "");
    }

out:
    xmlBufFree(buf);
    return(ret);
}